

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O3

REF_STATUS
ref_import_bin_ugrid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename,REF_BOOL swap,REF_BOOL fat
          )

{
  REF_DBL *pRVar1;
  REF_GRID_conflict pRVar2;
  REF_NODE ref_node;
  ulong uVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  REF_DBL RVar6;
  uint uVar7;
  FILE *__stream;
  void *__ptr;
  size_t sVar8;
  ulong uVar9;
  undefined8 uVar10;
  size_t __n;
  REF_GLOB global;
  char *pcVar11;
  long n_global;
  REF_INT new_node;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  long local_98;
  int local_80;
  REF_INT local_7c;
  REF_INT local_78;
  REF_INT local_74;
  REF_INT local_70;
  REF_INT local_6c;
  REF_INT local_68;
  uint local_64;
  ulong local_60;
  ulong local_58;
  void *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  uVar7 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar7 == 0) {
    pRVar2 = *ref_grid_ptr;
    ref_node = pRVar2->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar11 = "unable to open file";
      uVar10 = 0x233;
LAB_00148259:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar10,"ref_import_bin_ugrid",pcVar11);
      return 2;
    }
    uVar7 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,(REF_INT *)&local_64);
    if (uVar7 == 0) {
      uVar7 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_68);
      if (uVar7 == 0) {
        uVar7 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_6c);
        if (uVar7 == 0) {
          uVar7 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_70);
          if (uVar7 == 0) {
            uVar7 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_74);
            if (uVar7 == 0) {
              uVar7 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_78);
              if (uVar7 == 0) {
                uVar7 = ref_import_bin_ugrid_chunk((FILE *)__stream,swap,fat,1,&local_7c);
                if (uVar7 == 0) {
                  if (0 < ref_mpi->timing) {
                    ref_mpi_stopwatch_stop(ref_mpi,"ugrid header");
                  }
                  n_global = (long)(int)local_64;
                  local_40 = 1000000;
                  if ((int)local_64 < 1000000) {
                    local_40 = (ulong)local_64;
                  }
                  if (n_global < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x241,"ref_import_bin_ugrid","malloc xyz of REF_DBL negative");
                    return 1;
                  }
                  __ptr = malloc((ulong)(uint)((int)local_40 * 0x18));
                  if (__ptr == (void *)0x0) {
                    pcVar11 = "malloc xyz of REF_DBL NULL";
                    uVar10 = 0x241;
                    goto LAB_00148259;
                  }
                  if (local_64 != 0) {
                    uVar9 = 0;
                    local_50 = __ptr;
                    local_48 = n_global;
                    do {
                      uVar7 = (int)local_48 - (int)uVar9;
                      local_60 = (ulong)uVar7;
                      if ((int)local_40 < (int)uVar7) {
                        local_60 = local_40 & 0xffffffff;
                      }
                      uVar5 = (int)local_60 * 3;
                      __n = (size_t)(int)uVar5;
                      local_58 = uVar9;
                      sVar8 = fread(local_50,8,__n,__stream);
                      if (sVar8 != __n) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x246,"ref_import_bin_ugrid","xyz",__n,sVar8);
                        return 1;
                      }
                      if ((swap != 0) && (0 < (int)uVar7)) {
                        if ((int)uVar5 < 2) {
                          uVar5 = 1;
                        }
                        uVar9 = 0;
                        do {
                          uVar3 = *(ulong *)((long)local_50 + uVar9 * 8);
                          *(ulong *)((long)local_50 + uVar9 * 8) =
                               uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                               (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                               (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                               (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
                          uVar9 = uVar9 + 1;
                        } while (uVar5 != uVar9);
                      }
                      if (0 < (int)uVar7) {
                        uVar9 = 1;
                        if (1 < (int)local_60) {
                          uVar9 = local_60 & 0xffffffff;
                        }
                        global = (REF_GLOB)(int)local_58;
                        local_38 = uVar9 * 0x18;
                        local_98 = 0;
                        do {
                          uVar7 = ref_node_add(ref_node,global,&local_80);
                          if (uVar7 != 0) {
                            pcVar11 = "new_node";
                            uVar10 = 0x24a;
                            goto LAB_001481a0;
                          }
                          pRVar4 = ref_node->real;
                          RVar6 = ((REF_DBL *)((long)local_50 + local_98))[1];
                          pRVar1 = pRVar4 + (long)local_80 * 0xf;
                          *pRVar1 = *(REF_DBL *)((long)local_50 + local_98);
                          pRVar1[1] = RVar6;
                          pRVar4[(long)local_80 * 0xf + 2] =
                               *(REF_DBL *)((long)local_50 + local_98 + 0x10);
                          local_98 = local_98 + 0x18;
                          global = global + 1;
                        } while (local_38 != local_98);
                      }
                      uVar7 = (int)local_60 + (int)local_58;
                      uVar9 = (ulong)uVar7;
                      __ptr = local_50;
                      n_global = local_48;
                    } while ((int)uVar7 < (int)local_48);
                  }
                  free(__ptr);
                  uVar7 = ref_node_initialize_n_global(ref_node,n_global);
                  if (uVar7 == 0) {
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid node");
                    }
                    uVar7 = ref_import_bin_ugrid_c2n
                                      (pRVar2->cell[3],local_68,(FILE *)__stream,swap,fat);
                    if (uVar7 == 0) {
                      uVar7 = ref_import_bin_ugrid_c2n
                                        (pRVar2->cell[6],local_6c,(FILE *)__stream,swap,fat);
                      if (uVar7 == 0) {
                        uVar7 = ref_import_bin_ugrid_bound_tag
                                          (pRVar2->cell[3],local_68,(FILE *)__stream,swap,fat);
                        if (uVar7 == 0) {
                          uVar7 = ref_import_bin_ugrid_bound_tag
                                            (pRVar2->cell[6],local_6c,(FILE *)__stream,swap,fat);
                          if (uVar7 == 0) {
                            if (0 < ref_mpi->timing) {
                              ref_mpi_stopwatch_stop(ref_mpi,"ugrid tri");
                            }
                            uVar7 = ref_import_bin_ugrid_c2n
                                              (pRVar2->cell[8],local_70,(FILE *)__stream,swap,fat);
                            if (uVar7 == 0) {
                              if (0 < ref_mpi->timing) {
                                ref_mpi_stopwatch_stop(ref_mpi,"ugrid tet");
                              }
                              uVar7 = ref_import_bin_ugrid_c2n
                                                (pRVar2->cell[9],local_74,(FILE *)__stream,swap,fat)
                              ;
                              if (uVar7 == 0) {
                                if (0 < ref_mpi->timing) {
                                  ref_mpi_stopwatch_stop(ref_mpi,"ugrid pyr");
                                }
                                uVar7 = ref_import_bin_ugrid_c2n
                                                  (pRVar2->cell[10],local_78,(FILE *)__stream,swap,
                                                   fat);
                                if (uVar7 == 0) {
                                  if (0 < ref_mpi->timing) {
                                    ref_mpi_stopwatch_stop(ref_mpi,"ugrid pri");
                                  }
                                  uVar7 = ref_import_bin_ugrid_c2n
                                                    (pRVar2->cell[0xb],local_7c,(FILE *)__stream,
                                                     swap,fat);
                                  if (uVar7 == 0) {
                                    if (0 < ref_mpi->timing) {
                                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid hex");
                                    }
                                    fclose(__stream);
                                    return 0;
                                  }
                                  pcVar11 = "hex face nodes";
                                  uVar10 = 0x26e;
                                }
                                else {
                                  pcVar11 = "pri face nodes";
                                  uVar10 = 0x26b;
                                }
                              }
                              else {
                                pcVar11 = "pyr face nodes";
                                uVar10 = 0x268;
                              }
                            }
                            else {
                              pcVar11 = "tet face nodes";
                              uVar10 = 0x265;
                            }
                          }
                          else {
                            pcVar11 = "tri face tags";
                            uVar10 = 0x261;
                          }
                        }
                        else {
                          pcVar11 = "tri face tags";
                          uVar10 = 0x25e;
                        }
                      }
                      else {
                        pcVar11 = "qua face nodes";
                        uVar10 = 0x25a;
                      }
                    }
                    else {
                      pcVar11 = "tri face nodes";
                      uVar10 = 600;
                    }
                  }
                  else {
                    pcVar11 = "init glob";
                    uVar10 = 0x253;
                  }
                }
                else {
                  pcVar11 = "nhex";
                  uVar10 = 0x23b;
                }
              }
              else {
                pcVar11 = "npri";
                uVar10 = 0x23a;
              }
            }
            else {
              pcVar11 = "npyr";
              uVar10 = 0x239;
            }
          }
          else {
            pcVar11 = "ntet";
            uVar10 = 0x238;
          }
        }
        else {
          pcVar11 = "nqua";
          uVar10 = 0x237;
        }
      }
      else {
        pcVar11 = "ntri";
        uVar10 = 0x236;
      }
    }
    else {
      pcVar11 = "nnode";
      uVar10 = 0x235;
    }
  }
  else {
    pcVar11 = "create grid";
    uVar10 = 0x22d;
  }
LAB_001481a0:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar10,
         "ref_import_bin_ugrid",(ulong)uVar7,pcVar11);
  return uVar7;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi,
                                               const char *filename,
                                               REF_BOOL swap, REF_BOOL fat) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;

  REF_INT node, new_node;
  REF_INT max_chunk, nread, chunk, ixyz;
  REF_DBL *xyz;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nnode), "nnode");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &ntri), "ntri");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nqua), "nqua");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &ntet), "ntet");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &npyr), "npyr");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &npri), "npri");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nhex), "nhex");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  /* large block reads recommended for IO performance */
  max_chunk = MIN(1000000, nnode);
  ref_malloc(xyz, 3 * max_chunk, REF_DBL);
  nread = 0;
  while (nread < nnode) {
    chunk = MIN(max_chunk, nnode - nread);
    REIS(3 * chunk, fread(xyz, sizeof(REF_DBL), (size_t)(3 * chunk), file),
         "xyz");
    if (swap)
      for (ixyz = 0; ixyz < 3 * chunk; ixyz++) SWAP_DBL(xyz[ixyz]);
    for (node = 0; node < chunk; node++) {
      RSS(ref_node_add(ref_node, node + nread, &new_node), "new_node");
      ref_node_xyz(ref_node, 0, new_node) = xyz[0 + 3 * node];
      ref_node_xyz(ref_node, 1, new_node) = xyz[1 + 3 * node];
      ref_node_xyz(ref_node, 2, new_node) = xyz[2 + 3 * node];
    }
    nread += chunk;
  }
  ref_free(xyz);

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  RSS(ref_import_bin_ugrid_c2n(ref_grid_tri(ref_grid), ntri, file, swap, fat),
      "tri face nodes");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_qua(ref_grid), nqua, file, swap, fat),
      "qua face nodes");

  RSS(ref_import_bin_ugrid_bound_tag(ref_grid_tri(ref_grid), ntri, file, swap,
                                     fat),
      "tri face tags");
  RSS(ref_import_bin_ugrid_bound_tag(ref_grid_qua(ref_grid), nqua, file, swap,
                                     fat),
      "tri face tags");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tri");

  RSS(ref_import_bin_ugrid_c2n(ref_grid_tet(ref_grid), ntet, file, swap, fat),
      "tet face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tet");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_pyr(ref_grid), npyr, file, swap, fat),
      "pyr face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pyr");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_pri(ref_grid), npri, file, swap, fat),
      "pri face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pri");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_hex(ref_grid), nhex, file, swap, fat),
      "hex face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid hex");

  fclose(file);

  return REF_SUCCESS;
}